

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

CBString * __thiscall
Bstrlib::CBString::operator+(CBString *__return_storage_ptr__,CBString *this,uchar *s)

{
  CBStringException *this_00;
  allocator local_59;
  string local_58;
  CBStringException bstr__cppwrapper_exception;
  
  if (s != (uchar *)0x0) {
    CBString(__return_storage_ptr__,this);
    operator+=(__return_storage_ptr__,(char *)s);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string
            ((string *)&local_58,"CBString::Failure in + (unsigned char *) operator, NULL",&local_59
            );
  CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(this_00,&bstr__cppwrapper_exception);
  __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

const CBString CBString::operator + (const unsigned char *s) const {
	if (s == NULL) bstringThrow ("Failure in + (unsigned char *) operator, NULL");
	CBString retval (*this);
	retval += (const char *) s;
	return retval;
}